

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O3

int __thiscall ncnn::Layer::forward(Layer *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  void *in_R8;
  Mat local_60;
  
  iVar2 = -1;
  if (this->support_inplace == true) {
    Mat::clone(&local_60,(__fn *)bottom_blob,opt->blob_allocator,(int)opt,in_R8);
    if (&local_60 != top_blob) {
      if (local_60.refcount != (int *)0x0) {
        LOCK();
        *local_60.refcount = *local_60.refcount + 1;
        UNLOCK();
      }
      piVar1 = top_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->data = local_60.data;
      top_blob->refcount = local_60.refcount;
      top_blob->elemsize = local_60.elemsize;
      top_blob->elempack = local_60.elempack;
      top_blob->allocator = local_60.allocator;
      top_blob->dims = local_60.dims;
      top_blob->w = local_60.w;
      top_blob->h = local_60.h;
      top_blob->c = local_60.c;
      top_blob->cstep = local_60.cstep;
    }
    if (local_60.refcount != (int *)0x0) {
      LOCK();
      *local_60.refcount = *local_60.refcount + -1;
      UNLOCK();
      if (*local_60.refcount == 0) {
        if (local_60.allocator == (Allocator *)0x0) {
          if (local_60.data != (void *)0x0) {
            free(local_60.data);
          }
        }
        else {
          (*(local_60.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar2 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar2 = (*this->_vptr_Layer[9])(this,top_blob,opt);
    }
  }
  return iVar2;
}

Assistant:

int Layer::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blob = bottom_blob.clone(opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    return forward_inplace(top_blob, opt);
}